

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O1

variant<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
* __thiscall
hta::Metric::retrieve_flex
          (variant<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
           *__return_storage_ptr__,Metric *this,TimePoint begin,TimePoint end,
          Duration interval_upper_limit,IntervalScope scope,bool smooth)

{
  long lVar1;
  long lVar2;
  _Head_base<0UL,_hta::storage::Metric_*,_false> _Var3;
  pointer pRVar4;
  Metric *pMVar5;
  duration<long,_std::ratio<1L,_1000000000L>_> dVar6;
  void *pvVar7;
  TimeAggregate *ta;
  pointer pRVar8;
  int iVar9;
  pointer pRVar10;
  int iVar11;
  void *args_1;
  initializer_list<hta::Row> __l;
  vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> result;
  vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> raw_ts;
  vector<hta::Row,_std::allocator<hta::Row>_> local_128;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_110;
  vector<hta::Row,_std::allocator<hta::Row>_> local_108;
  Metric *local_e8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_e0;
  long local_d8;
  IntervalScope local_d0;
  Row local_c8;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_80;
  variant<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
  *local_78;
  pointer local_70;
  pointer local_68;
  Aggregate local_60;
  
  local_e8 = this;
  check_read(this);
  local_110.__d.__r =
       (duration)
       (duration)
       end.super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
       __d.__r;
  if ((((long)end.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r <
        (long)begin.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r) && (scope.begin != infinity)) &&
     (((ulong)scope & 0xffffffff00000000) != 0x300000000)) {
    throw_exception<hta::Exception,char_const*,hta::Clock::time_point,char_const*,hta::Clock::time_point>
              ("Metric::retrieve(interval_upper_limit) invalid request: begin timestamp ",
               (time_point)
               begin.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r," larger than end timestamp ",
               (time_point)
               end.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r);
  }
  if (interval_upper_limit.__r < 0) {
    aggregate(&local_60,local_e8,begin,end);
    local_c8.aggregate.integral = local_60.integral;
    local_c8.aggregate.active_time.__r = local_60.active_time.__r;
    local_c8.aggregate.sum = local_60.sum;
    local_c8.aggregate.count = local_60.count;
    local_c8.aggregate.minimum = local_60.minimum;
    local_c8.aggregate.maximum = local_60.maximum;
    __l._M_len = 1;
    __l._M_array = &local_c8;
    local_c8.interval.__r =
         (long)end.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r -
         (long)begin.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r;
    local_c8.time.
    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r
         = begin.
           super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
           __d.__r;
    std::vector<hta::Row,_std::allocator<hta::Row>_>::vector
              (&local_128,__l,(allocator_type *)&local_108);
    *(pointer *)
     &(__return_storage_ptr__->
      super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
      ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
      super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
      super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
      super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
      super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>._M_u =
         local_128.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
             ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
             super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
             super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
             super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
             super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>._M_u
     + 8) = local_128.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
            super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
             ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
             super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
             super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
             super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
             super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>._M_u
     + 0x10) = local_128.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->
    super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
    ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
    super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
    super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
    super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
    super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>._M_index =
         '\0';
  }
  else {
    pvVar7 = (void *)(local_e8->interval_min_).__r;
    local_d0 = scope;
    if (interval_upper_limit.__r < (long)pvVar7) {
      retrieve((vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *)&local_c8,local_e8,begin,
               end,scope);
      if (((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
           local_c8.interval.__r ==
           local_c8.time.
           super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
           __d.__r) ||
         (!smooth ||
          (ulong)interval_upper_limit.__r <=
          (ulong)((long)end.
                        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        .__d.__r -
                 (long)begin.
                       super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       .__d.__r) /
          (ulong)((long)local_c8.time.
                        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        .__d.__r - local_c8.interval.__r >> 4))) {
        *(rep *)&(__return_storage_ptr__->
                 super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                 ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 _M_u = local_c8.interval.__r;
        *(time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> *)
         ((long)&(__return_storage_ptr__->
                 super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                 ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 _M_u + 8) =
             local_c8.time.
             super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             .__d.__r;
        *(Value *)((long)&(__return_storage_ptr__->
                          super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                          ).
                          super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>
                          .
                          super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>
                          .
                          super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>
                          .
                          super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>
                          .
                          super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>
                          ._M_u + 0x10) = local_c8.aggregate.minimum;
        local_c8.interval.__r = 0;
        local_c8.time.
        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d
        .__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
               (duration)0x0;
        local_c8.aggregate.minimum = 0.0;
        (__return_storage_ptr__->
        super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
        ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
        super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
        super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
        super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
        super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>._M_index =
             '\x01';
      }
      else {
        convert_timevalues_smooth
                  (&local_128,(vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *)&local_c8,
                   begin,(TimePoint)local_110.__d.__r,interval_upper_limit);
        *(pointer *)
         &(__return_storage_ptr__->
          super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
          ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
          super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
          super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
          super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
          super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>._M_u =
             local_128.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(pointer *)
         ((long)&(__return_storage_ptr__->
                 super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                 ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 _M_u + 8) =
             local_128.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
             super__Vector_impl_data._M_finish;
        *(pointer *)
         ((long)&(__return_storage_ptr__->
                 super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                 ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 _M_u + 0x10) =
             local_128.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_128.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_128.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_128.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->
        super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
        ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
        super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
        super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
        super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
        super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>._M_index =
             '\0';
      }
      if ((void *)local_c8.interval.__r != (void *)0x0) {
        operator_delete((void *)local_c8.interval.__r,
                        (long)local_c8.aggregate.minimum - local_c8.interval.__r);
      }
    }
    else {
      lVar1 = (local_e8->interval_max_).__r;
      lVar2 = (local_e8->interval_factor_).factor_;
      if (lVar1 < interval_upper_limit.__r) {
        interval_upper_limit.__r = lVar1;
      }
      do {
        args_1 = pvVar7;
        pvVar7 = (void *)(lVar2 * (long)args_1);
        if (SEXT816((long)pvVar7) != SEXT816(lVar2) * SEXT816((long)args_1)) {
          throw_exception<hta::Exception,char_const*>
                    ("integer overflow during interval multiplication");
        }
        local_d8 = interval_upper_limit.__r;
        local_80.__d.__r =
             (duration)
             (duration)
             begin.
             super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             .__d.__r;
        local_78 = __return_storage_ptr__;
      } while ((long)pvVar7 <= interval_upper_limit.__r);
      do {
        pMVar5 = local_e8;
        if (interval_upper_limit.__r < (long)args_1) {
          __assert_fail("interval <= interval_upper_limit",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                        ,0x18c,
                        "std::variant<std::vector<Row>, std::vector<TimeValue>> hta::Metric::retrieve_flex(TimePoint, TimePoint, Duration, IntervalScope, bool)"
                       );
        }
        _Var3._M_head_impl =
             (local_e8->storage_metric_)._M_t.
             super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>
             ._M_t.
             super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>
             .super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl;
        (*(_Var3._M_head_impl)->_vptr_Metric[6])
                  (&local_128,_Var3._M_head_impl,
                   begin.
                   super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   .__d.__r,local_110.__d.__r,args_1,local_d0);
        local_68 = local_128.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_70 = local_128.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        if (local_128.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_128.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          lVar1 = (pMVar5->interval_factor_).factor_;
          pvVar7 = (void *)((long)args_1 / lVar1);
          if (((long)args_1 < 1) || ((long)args_1 % lVar1 != 0)) {
            throw_exception<hta::Exception,char_const*,long,char_const*,long>
                      ("interval ",(long)args_1," not divisible by ",lVar1);
          }
        }
        else {
          iVar11 = 1;
          if (smooth) {
            iVar11 = (int)(local_d8 / (long)args_1);
          }
          local_108.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_108.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
          super__Vector_impl_data._M_finish = (Row *)0x0;
          local_108.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (Row *)0x0;
          local_e0.__r = (rep)args_1;
          std::vector<hta::Row,_std::allocator<hta::Row>_>::reserve
                    (&local_108,
                     ((long)iVar11 +
                     (ulong)(((long)local_128.
                                    super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)local_128.
                                    super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
                                    super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7) /
                     (ulong)(long)iVar11) - 1);
          dVar6.__r = local_e0.__r;
          pRVar4 = local_128.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pRVar10 = local_128.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (iVar11 == 1) {
            for (; pRVar10 != pRVar4; pRVar10 = (pointer)&(pRVar10->aggregate).active_time) {
              local_c8.time.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          )(((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)&(pRVar10->interval).__r)->__d).__r;
              local_c8.aggregate.integral = (Value)(pRVar10->aggregate).count;
              local_c8.aggregate.active_time.__r = ((Duration *)&(pRVar10->aggregate).integral)->__r
              ;
              local_c8.aggregate.sum = (pRVar10->aggregate).maximum;
              local_c8.aggregate.count = (uint64_t)(pRVar10->aggregate).sum;
              local_c8.aggregate.minimum = ((Aggregate *)&pRVar10->time)->minimum;
              local_c8.aggregate.maximum = (pRVar10->aggregate).minimum;
              local_c8.interval.__r = dVar6.__r;
              if (local_108.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_108.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<hta::Row,_std::allocator<hta::Row>_>::_M_realloc_insert<hta::Row>
                          (&local_108,
                           (iterator)
                           local_108.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl
                           .super__Vector_impl_data._M_finish,&local_c8);
              }
              else {
                ((local_108.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
                  super__Vector_impl_data._M_finish)->aggregate).integral =
                     local_c8.aggregate.integral;
                ((local_108.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
                  super__Vector_impl_data._M_finish)->aggregate).active_time.__r =
                     local_c8.aggregate.active_time.__r;
                ((local_108.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
                  super__Vector_impl_data._M_finish)->aggregate).sum = local_c8.aggregate.sum;
                ((local_108.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
                  super__Vector_impl_data._M_finish)->aggregate).count = local_c8.aggregate.count;
                ((local_108.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
                  super__Vector_impl_data._M_finish)->aggregate).minimum =
                     local_c8.aggregate.minimum;
                ((local_108.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
                  super__Vector_impl_data._M_finish)->aggregate).maximum =
                     local_c8.aggregate.maximum;
                ((local_108.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
                  super__Vector_impl_data._M_finish)->interval).__r = dVar6.__r;
                ((local_108.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
                  super__Vector_impl_data._M_finish)->time).
                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                .__d.__r = (rep)local_c8.time.
                                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                .__d.__r;
                local_108.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_108.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
          }
          else {
            if (iVar11 < 2) {
              __assert_fail("smooth_factor > 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                            ,0x147,
                            "std::vector<Row> hta::convert_timeaggregates_to_rows(std::vector<TimeAggregate> &, Duration, int)"
                           );
            }
            if (local_128.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_128.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              pRVar10 = (pointer)0x0;
            }
            else {
              iVar9 = 0;
              pRVar10 = (pointer)0x0;
              pRVar8 = local_128.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
                       super__Vector_impl_data._M_start;
              do {
                if (pRVar10 == (pointer)0x0) {
                  iVar9 = 1;
                  pRVar10 = pRVar8;
                }
                else {
                  Aggregate::operator+=((Aggregate *)&pRVar10->time,*(Aggregate *)&pRVar8->time);
                  iVar9 = iVar9 + 1;
                }
                if (iVar9 == iVar11) {
                  std::vector<hta::Row,std::allocator<hta::Row>>::
                  emplace_back<std::chrono::duration<long,std::ratio<1l,1000000000l>>&,hta::TimeAggregate&>
                            ((vector<hta::Row,std::allocator<hta::Row>> *)&local_108,&local_e0,
                             (TimeAggregate *)pRVar10);
                  pRVar10 = (pointer)0x0;
                }
                pRVar8 = (pointer)&(pRVar8->aggregate).active_time;
              } while (pRVar8 != pRVar4);
            }
            __return_storage_ptr__ = local_78;
            begin.
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r = local_80;
            if (pRVar10 != (pointer)0x0) {
              std::vector<hta::Row,std::allocator<hta::Row>>::
              emplace_back<std::chrono::duration<long,std::ratio<1l,1000000000l>>&,hta::TimeAggregate&>
                        ((vector<hta::Row,std::allocator<hta::Row>> *)&local_108,&local_e0,
                         (TimeAggregate *)pRVar10);
            }
          }
          *(pointer *)
           &(__return_storage_ptr__->
            super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
            ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
            super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
            super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
            super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
            super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>._M_u =
               local_108.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
               super__Vector_impl_data._M_start;
          *(pointer *)
           ((long)&(__return_storage_ptr__->
                   super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                   ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                   super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                   super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                   super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                   super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>
                   ._M_u + 8) =
               local_108.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
               super__Vector_impl_data._M_finish;
          *(pointer *)
           ((long)&(__return_storage_ptr__->
                   super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                   ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                   super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                   super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                   super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                   super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>
                   ._M_u + 0x10) =
               local_108.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_108.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_108.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_108.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->
          super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
          ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
          super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
          super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
          super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
          super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>._M_index
               = '\0';
          pvVar7 = args_1;
          interval_upper_limit.__r = local_d8;
        }
        if (local_128.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_128.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_128.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_128.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_68 != local_70) {
          return __return_storage_ptr__;
        }
        args_1 = pvVar7;
      } while ((local_e8->interval_min_).__r <= (long)pvVar7);
      *(undefined8 *)
       &(__return_storage_ptr__->
        super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
        ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
        super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
        super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
        super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
        super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>._M_u = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
               ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
               super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
               super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
               super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
               super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
               _M_u + 8) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
               ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
               super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
               super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
               super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
               super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
               _M_u + 0x10) = 0;
      (__return_storage_ptr__->
      super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
      ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
      super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
      super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
      super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
      super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>._M_index =
           '\x01';
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::variant<std::vector<Row>, std::vector<TimeValue>>
Metric::retrieve_flex(TimePoint begin, TimePoint end, Duration interval_upper_limit,
                      IntervalScope scope, bool smooth)
{
    check_read();
    if (begin > end && scope.begin != Scope::infinity && scope.end != Scope::infinity)
    {
        throw_exception("Metric::retrieve(interval_upper_limit) invalid request: begin timestamp ",
                        begin, " larger than end timestamp ", end);
    }
    if (interval_upper_limit.count() < 0)
    {
        // Get single aggregate
        return std::vector<Row>{ Row(end - begin, begin, aggregate(begin, end)) };
    }
    if (interval_upper_limit < interval_min_)
    {
        // Use raw data
        auto raw_ts = retrieve(begin, end, scope);
        if (raw_ts.empty())
        {
            return raw_ts;
        }
        auto average_interval = (end - begin) / raw_ts.size();
        if (average_interval < interval_upper_limit && smooth)
        {
            // too many raw data points, must reduce
            // TODO respect scope
            return convert_timevalues_smooth(raw_ts, begin, end, interval_upper_limit);
        }
        return raw_ts;
    }
    auto interval = interval_min_;
    interval_upper_limit = std::min(interval_upper_limit, interval_max_);
    while (interval * interval_factor_ <= interval_upper_limit)
    {
        interval = interval * interval_factor_;
    }
    do
    {
        assert(interval <= interval_upper_limit);
        auto result = storage_metric_->get(begin, end, interval, scope);
        if (!result.empty())
        {
            int smooth_factor = 1;
            if (smooth)
            {
                smooth_factor = interval_upper_limit / interval;
            }
            return convert_timeaggregates_to_rows(result, interval, smooth_factor);
        }
        // If the requested level has no data yet, we must ask the lower levels
        interval = interval / interval_factor_;
    } while (interval >= interval_min_);
    // No data at all
    return std::vector<TimeValue>{};
}